

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationengine.cpp
# Opt level: O1

ResultValue * __thiscall
CalculationEngine::evaluate
          (ResultValue *__return_storage_ptr__,CalculationEngine *this,string *expressionString,
          Environment *environment)

{
  pointer pcVar1;
  int64_t iVar2;
  undefined8 uVar3;
  ResultValueType RVar4;
  undefined4 uVar5;
  mapped_type *pmVar6;
  EvaluationStack *pEVar7;
  runtime_error *this_00;
  _Elt_pointer pRVar8;
  unique_ptr<Expression,_std::default_delete<Expression>_> expression;
  vector<Token,_std::allocator<Token>_> tokens;
  Parser parser;
  CalculationVisitor calculationVisitor;
  undefined1 local_160 [8];
  undefined1 local_158 [16];
  undefined1 local_148 [64];
  undefined1 local_108 [8];
  vector<Token,_std::allocator<Token>_> local_100;
  pointer local_e0;
  _Alloc_hider local_d8;
  pointer local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  CalculationVisitor local_90;
  
  Environment::setEvalMode(environment,this->mEvalMode);
  pcVar1 = (expressionString->_M_dataplus)._M_p;
  local_158._0_8_ = (pointer)(local_158 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_160 + 8),pcVar1,pcVar1 + expressionString->_M_string_length);
  pmVar6 = std::__detail::
           _Map_base<ResultValueType,_std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>,_std::allocator<std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<ResultValueType,_std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>,_std::allocator<std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->mNumberTypes,&this->mEvalMode);
  Tokenizer::tokenize((vector<Token,_std::allocator<Token>_> *)(local_148 + 0x10),
                      (string *)(local_160 + 8),
                      (pmVar6->_M_t).
                      super___uniq_ptr_impl<NumberType,_std::default_delete<NumberType>_>._M_t.
                      super__Tuple_impl<0UL,_NumberType_*,_std::default_delete<NumberType>_>.
                      super__Head_base<0UL,_NumberType_*,_false>._M_head_impl);
  if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
  }
  Token::Token((Token *)local_108,END_OF_EXPRESSION);
  std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
            ((vector<Token,_std::allocator<Token>_> *)(local_148 + 0x10),(Token *)local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
  }
  if (local_100.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<Token,_std::allocator<Token>_>::vector
            ((vector<Token,_std::allocator<Token>_> *)(local_148 + 0x28),
             (vector<Token,_std::allocator<Token>_> *)(local_148 + 0x10));
  Parser::Parser((Parser *)local_108,(vector<Token,_std::allocator<Token>_> *)(local_148 + 0x28),
                 this);
  std::vector<Token,_std::allocator<Token>_>::~vector
            ((vector<Token,_std::allocator<Token>_> *)(local_148 + 0x28));
  Parser::parse((Parser *)local_160);
  CalculationVisitor::CalculationVisitor(&local_90,this,environment);
  (**(code **)(*(long *)local_160 + 0x10))(local_160,&local_90,0);
  pEVar7 = CalculationVisitor::evaluationStack(&local_90);
  pRVar8 = (pEVar7->c).super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pRVar8 != (pEVar7->c).super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    if (pRVar8 == (pEVar7->c).super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pRVar8 = (pEVar7->c).super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
    }
    *(undefined8 *)((__return_storage_ptr__->mComplexValue)._M_value + 8) =
         *(undefined8 *)(pRVar8[-1].mComplexValue._M_value + 8);
    RVar4 = pRVar8[-1].mType;
    uVar5 = *(undefined4 *)&pRVar8[-1].field_0x4;
    iVar2 = pRVar8[-1].mIntValue;
    uVar3 = *(undefined8 *)pRVar8[-1].mComplexValue._M_value;
    __return_storage_ptr__->mFloatValue = pRVar8[-1].mFloatValue;
    *(undefined8 *)(__return_storage_ptr__->mComplexValue)._M_value = uVar3;
    __return_storage_ptr__->mType = RVar4;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar5;
    __return_storage_ptr__->mIntValue = iVar2;
    local_90.super_DfsVisitor.super_Visitor._vptr_Visitor =
         (Visitor)&PTR__CalculationVisitor_00148638;
    std::_Deque_base<ResultValue,_std::allocator<ResultValue>_>::~_Deque_base
              ((_Deque_base<ResultValue,_std::allocator<ResultValue>_> *)&local_90.mEvaluationStack)
    ;
    if (local_160 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_160 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if (local_e0 != (pointer)0x0) {
      operator_delete(local_e0,(long)local_d0 - (long)local_e0);
    }
    std::vector<Token,_std::allocator<Token>_>::~vector(&local_100);
    std::vector<Token,_std::allocator<Token>_>::~vector
              ((vector<Token,_std::allocator<Token>_> *)(local_148 + 0x10));
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Expected result.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ResultValue CalculationEngine::evaluate(const std::string& expressionString, Environment& environment) {
	environment.setEvalMode(mEvalMode);

	//Tokenize
	auto tokens = Tokenizer::tokenize(expressionString, currentNumberType());
	tokens.push_back(Token(TokenType::END_OF_EXPRESSION));

	//Parse
	Parser parser(tokens, *this);
	auto expression = parser.parse();

	//Evaluate
	CalculationVisitor calculationVisitor(*this, environment);
	expression->accept(calculationVisitor, nullptr);

	auto& evaluationStack = calculationVisitor.evaluationStack();
	if (evaluationStack.empty()) {
		throw std::runtime_error("Expected result.");
	}

	return evaluationStack.top();
}